

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeArrayGet(TranslateToFuzzReader *this,Type type)

{
  Builder *builder;
  bool signed_;
  bool bVar1;
  mapped_type *vec;
  value_type *pvVar2;
  Expression *pEVar3;
  Expression *index;
  ArrayGet *pAVar4;
  If *pIVar5;
  ulong uVar6;
  optional<wasm::Type> type_00;
  undefined1 local_68 [8];
  BoundsCheck check;
  value_type arrayType;
  key_type local_38;
  Type type_local;
  
  local_38.id = type.id;
  vec = std::__detail::
        _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)&this->typeArrays,&local_38);
  if ((vec->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (vec->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    __assert_fail("!arrays.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x13aa,"Expression *wasm::TranslateToFuzzReader::makeArrayGet(Type)");
  }
  pvVar2 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                     (&this->random,vec);
  check.getLength = (Expression *)pvVar2->id;
  pEVar3 = makeTrappingRefUse(this,(HeapType)check.getLength);
  index = make(this,(Type)0x2);
  wasm::HeapType::getArray();
  signed_ = maybeSignedGet(this,(Field *)local_68);
  if ((this->allowOOB == true) && (bVar1 = Random::oneIn(&this->random,10), bVar1)) {
    pAVar4 = Builder::makeArrayGet(&this->builder,pEVar3,index,(Type)local_38.id,signed_);
    return (Expression *)pAVar4;
  }
  builder = &this->builder;
  makeArrayBoundsCheck
            ((BoundsCheck *)local_68,pEVar3,index,this->funcContext->func,builder,(Expression *)0x0)
  ;
  uVar6 = (ulong)signed_;
  pAVar4 = Builder::makeArrayGet(builder,check.condition,check.getRef,(Type)local_38.id,signed_);
  pEVar3 = makeTrivial(this,(Type)local_38.id);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar6;
  pIVar5 = Builder::makeIf(builder,(Expression *)local_68,(Expression *)pAVar4,pEVar3,type_00);
  return (Expression *)pIVar5;
}

Assistant:

Expression* TranslateToFuzzReader::makeArrayGet(Type type) {
  auto& arrays = typeArrays[type];
  assert(!arrays.empty());
  auto arrayType = pick(arrays);
  auto* ref = makeTrappingRefUse(arrayType);
  auto* index = make(Type::i32);
  auto signed_ = maybeSignedGet(arrayType.getArray().element);
  // Only rarely emit a plain get which might trap. See related logic in
  // ::makePointer().
  if (allowOOB && oneIn(10)) {
    return builder.makeArrayGet(ref, index, type, signed_);
  }
  // To avoid a trap, check the length dynamically using this pattern:
  //
  //   index < array.len ? array[index] : ..some fallback value..
  //
  auto check = makeArrayBoundsCheck(ref, index, funcContext->func, builder);
  auto* get = builder.makeArrayGet(check.getRef, check.getIndex, type, signed_);
  auto* fallback = makeTrivial(type);
  return builder.makeIf(check.condition, get, fallback);
}